

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

char * imap_atom(char *str,_Bool escape_only)

{
  bool bVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  int iVar5;
  char *local_68;
  char *p3;
  char *newstr;
  size_t newlen;
  long lStack_48;
  _Bool others_exists;
  size_t quote_count;
  size_t backsp_count;
  char *p2;
  char *p1;
  char cStack_20;
  char cStack_1f;
  char cStack_1e;
  char cStack_1d;
  char cStack_1c;
  char cStack_1b;
  char cStack_1a;
  char atom_specials [8];
  _Bool escape_only_local;
  char *str_local;
  
  p1._7_1_ = '(';
  cStack_20 = ')';
  cStack_1f = '{';
  cStack_1e = ' ';
  cStack_1d = '%';
  cStack_1c = '*';
  cStack_1b = ']';
  cStack_1a = '\0';
  quote_count = 0;
  lStack_48 = 0;
  bVar2 = false;
  p2 = str;
  if (str == (char *)0x0) {
    str_local = (char *)0x0;
  }
  else {
    for (; *p2 != '\0'; p2 = p2 + 1) {
      if (*p2 == '\\') {
        quote_count = quote_count + 1;
      }
      else if (*p2 == '\"') {
        lStack_48 = lStack_48 + 1;
      }
      else if (!escape_only) {
        local_68 = (char *)((long)&p1 + 7);
        while( true ) {
          bVar1 = false;
          if (*local_68 != '\0') {
            bVar1 = (bool)(bVar2 ^ 1);
          }
          if (!bVar1) break;
          if (*p2 == *local_68) {
            bVar2 = true;
          }
          local_68 = local_68 + 1;
        }
      }
    }
    atom_specials[0] = escape_only;
    unique0x100000e7 = str;
    if (((quote_count != 0) || (lStack_48 != 0)) || (bVar2)) {
      sVar3 = strlen(str);
      iVar5 = 2;
      if ((atom_specials[0] & 1U) != 0) {
        iVar5 = 0;
      }
      lVar4 = sVar3 + quote_count + lStack_48 + (long)iVar5;
      str_local = (char *)(*Curl_cmalloc)(lVar4 + 1);
      if (str_local == (char *)0x0) {
        str_local = (char *)0x0;
      }
      else {
        backsp_count = (size_t)str_local;
        if ((atom_specials[0] & 1U) == 0) {
          *str_local = '\"';
          str_local[lVar4 + -1] = '\"';
          backsp_count = (size_t)(str_local + 1);
        }
        for (p2 = stack0xffffffffffffffe8; *p2 != '\0'; p2 = p2 + 1) {
          if ((*p2 == '\\') || (*p2 == '\"')) {
            *(undefined1 *)backsp_count = 0x5c;
            backsp_count = backsp_count + 1;
          }
          *(char *)backsp_count = *p2;
          backsp_count = backsp_count + 1;
        }
        str_local[lVar4] = '\0';
      }
    }
    else {
      str_local = (*Curl_cstrdup)(str);
    }
  }
  return str_local;
}

Assistant:

static char *imap_atom(const char *str, bool escape_only)
{
  /* !checksrc! disable PARENBRACE 1 */
  const char atom_specials[] = "(){ %*]";
  const char *p1;
  char *p2;
  size_t backsp_count = 0;
  size_t quote_count = 0;
  bool others_exists = FALSE;
  size_t newlen = 0;
  char *newstr = NULL;

  if(!str)
    return NULL;

  /* Look for "atom-specials", counting the backslash and quote characters as
     these will need escapping */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\')
      backsp_count++;
    else if(*p1 == '"')
      quote_count++;
    else if(!escape_only) {
      const char *p3 = atom_specials;

      while(*p3 && !others_exists) {
        if(*p1 == *p3)
          others_exists = TRUE;

        p3++;
      }
    }

    p1++;
  }

  /* Does the input contain any "atom-special" characters? */
  if(!backsp_count && !quote_count && !others_exists)
    return strdup(str);

  /* Calculate the new string length */
  newlen = strlen(str) + backsp_count + quote_count + (escape_only ? 0 : 2);

  /* Allocate the new string */
  newstr = (char *) malloc((newlen + 1) * sizeof(char));
  if(!newstr)
    return NULL;

  /* Surround the string in quotes if necessary */
  p2 = newstr;
  if(!escape_only) {
    newstr[0] = '"';
    newstr[newlen - 1] = '"';
    p2++;
  }

  /* Copy the string, escaping backslash and quote characters along the way */
  p1 = str;
  while(*p1) {
    if(*p1 == '\\' || *p1 == '"') {
      *p2 = '\\';
      p2++;
    }

   *p2 = *p1;

    p1++;
    p2++;
  }

  /* Terminate the string */
  newstr[newlen] = '\0';

  return newstr;
}